

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O2

string * __thiscall
absl::lts_20240722::StrCat<std::__cxx11::string,char[179]>
          (string *__return_storage_ptr__,lts_20240722 *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,
          AlphaNum *d,AlphaNum *e,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [179])

{
  undefined8 local_80;
  undefined8 uStack_78;
  size_t local_70;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_58;
  size_t local_50;
  char *pcStack_48;
  size_t local_40;
  char *pcStack_38;
  char *local_30;
  size_t local_28;
  string_view local_20;
  
  local_80 = *(undefined8 *)this;
  uStack_78 = *(undefined8 *)(this + 8);
  local_70 = (a->piece_)._M_len;
  pcStack_68 = (a->piece_)._M_str;
  local_60 = (b->piece_)._M_len;
  pcStack_58 = (b->piece_)._M_str;
  local_50 = (c->piece_)._M_len;
  pcStack_48 = (c->piece_)._M_str;
  local_40 = (d->piece_)._M_len;
  pcStack_38 = (d->piece_)._M_str;
  local_28 = (e->piece_)._M_len;
  local_30 = (e->piece_)._M_str;
  local_20 = NullSafeStringView((Nullable<const_char_*>)args);
  absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(__return_storage_ptr__,&local_80,7);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}